

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Fail
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  bool isBody;
  ParseError *this_00;
  CharCount pos;
  CharCount encodedPos;
  
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  isBody = this->inBody;
  pos = Pos(this);
  encodedPos = Chars<unsigned_char>::OSB(this->next,this->input);
  ParseError::ParseError(this_00,isBody,pos,encodedPos,error);
  __cxa_throw(this_00,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::Fail(HRESULT error)
    {
        throw ParseError(inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
    }